

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FadeEffect_test.cpp
# Opt level: O2

void __thiscall fade_effect_converge_Test::TestBody(fade_effect_converge_Test *this)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  char *message;
  long lVar4;
  float fVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertionResult gtest_ar;
  AssertHelper local_80;
  ConvergeExpecation ces [6];
  
  ces[0].x = 'P';
  ces[0].y = 'Z';
  ces[0].ratio = 0.5;
  ces[0].result = 'U';
  ces[1].x = '\0';
  ces[1].y = 0xff;
  ces[1].ratio = 0.5;
  ces[1].result = '\x7f';
  ces[2].x = '2';
  ces[2].y = '\x14';
  ces[2].ratio = 0.3;
  ces[2].result = ')';
  ces[3].x = ' ';
  ces[3].y = '\x10';
  ces[3].ratio = 0.5;
  ces[3].result = '\x18';
  ces[4].x = '0';
  ces[4].y = '\0';
  ces[4].ratio = 0.5;
  ces[4].result = '\x18';
  ces[5].x = 0xff;
  ces[5].y = 0xe0;
  ces[5].ratio = 0.5;
  ces[5].result = 0xef;
  for (lVar4 = 0; lVar4 != 0x48; lVar4 = lVar4 + 0xc) {
    bVar2 = (&ces[0].x)[lVar4];
    fVar5 = (float)bVar2;
    bVar3 = (&ces[0].y)[lVar4];
    fVar1 = *(float *)((long)&ces[0].ratio + lVar4);
    if (bVar3 < bVar2) {
      fVar5 = fVar5 - fVar1 * (float)(int)((uint)bVar2 - (uint)bVar3);
    }
    else {
      fVar5 = fVar1 * (float)(int)((uint)bVar3 - (uint)bVar2) + fVar5;
    }
    local_98.ptr_._0_1_ = (undefined1)(int)fVar5;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)&gtest_ar,
               "(color_t)(ces[i].y >= ces[i].x ? ces[i].x + ces[i].ratio * (ces[i].y - ces[i].x) : ces[i].x - ces[i].ratio * (ces[i].x - ces[i].y) )"
               ,"ces[i].result",(uchar *)&local_98,&ces[0].result + lVar4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_98);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/kigster[P]librgb/test/src/FadeEffect_test.cpp"
                 ,0x2c,message);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_98);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(fade_effect, converge) {
    float r = 0.5;
    ConvergeExpecation ces[] = {
            {80,   90,   0.5, 85},
            {0,    255,  0.5, 127},
            {50,   20,   0.3, 41},
            {0x20, 0x10, r,   (color_t) (0x20 - r * (0x20 - 0x10))},
            {0x30, 0x00, r,   (color_t) (0x30 - r * (0x30 - 0x00))},
            {0xFF, 0xE0, r,   (color_t) (0xFF - r * (0xFF - 0xE0))},
    };

    for (int i = 0; i < sizeof(ces) / sizeof(ConvergeExpecation); i++) {
        EXPECT_CONVERGENCE(ces[i]);
    }
}